

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O0

void __thiscall msgpack11::MsgPack::MsgPack(MsgPack *this,int64_t value)

{
  shared_ptr<msgpack11::MsgPackInt64> local_28;
  int64_t local_18;
  int64_t value_local;
  MsgPack *this_local;
  
  local_18 = value;
  value_local = (int64_t)this;
  std::make_shared<msgpack11::MsgPackInt64,long&>((long *)&local_28);
  std::shared_ptr<msgpack11::MsgPackValue>::shared_ptr<msgpack11::MsgPackInt64,void>
            (&this->m_ptr,&local_28);
  std::shared_ptr<msgpack11::MsgPackInt64>::~shared_ptr(&local_28);
  return;
}

Assistant:

MsgPack::MsgPack(int64_t value)                    : m_ptr(make_shared<MsgPackInt64>(value)) {}